

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

float128 propagateFloat128NaN(float128 a,float128 b,float_status *status)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  float128 fVar12;
  
  uVar5 = b.high;
  uVar6 = b.low;
  uVar7 = a.high;
  uVar8 = a.low;
  bVar9 = 2;
  if (((~uVar7 & 0x7fff000000000000) == 0) &&
     (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
      uVar8 != 0)) {
    bVar9 = (((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) == (undefined1  [16])0x0 &&
             uVar8 == 0 || (uVar7 & 0x7fff800000000000) != 0x7fff000000000000) ^ 5;
  }
  if (((~uVar5 & 0x7fff000000000000) == 0) &&
     (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
      uVar6 != 0)) {
    bVar10 = (uVar5 & 0x7fff800000000000) == 0x7fff000000000000;
    bVar1 = ((undefined1  [16])b & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0;
    bVar11 = bVar9 == 5;
    bVar2 = !bVar11 || (bVar1 || uVar6 != 0) && bVar10;
    if ((!bVar1 && uVar6 == 0 || !bVar10) && !bVar11) goto LAB_00cfa6fc;
LAB_00cfa6f5:
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  else {
    bVar2 = false;
    bVar11 = true;
    if (bVar9 == 5) goto LAB_00cfa6f5;
LAB_00cfa6fc:
    bVar2 = false;
    bVar11 = false;
  }
  if (status->default_nan_mode != '\0') {
    uVar8 = 0;
    uVar6 = 0x7fff800000000000;
    goto LAB_00cfa7af;
  }
  uVar3 = uVar7 * 2;
  uVar4 = uVar5 * 2;
  bVar1 = true;
  if ((uVar4 <= uVar3) && (uVar6 <= uVar8 || uVar3 != uVar4)) {
    bVar1 = (uVar5 <= uVar7 && uVar3 <= uVar4) && (uVar8 <= uVar6 || uVar3 != uVar4);
  }
  if (bVar9 == 5) {
    bVar10 = bVar2 == true;
    if (bVar2 == true) {
      bVar10 = bVar1;
    }
    if (bVar10) goto LAB_00cfa771;
  }
  else if ((bVar9 != 4) || ((bVar2 != true && ((bool)(bVar2 == true & bVar1))))) {
LAB_00cfa771:
    uVar8 = uVar6;
    uVar6 = uVar5 | 0x800000000000;
    if (bVar2 != true) {
      uVar6 = uVar5;
    }
    goto LAB_00cfa7af;
  }
  uVar6 = uVar7 | 0x800000000000;
  if (!bVar11) {
    uVar6 = uVar7;
  }
LAB_00cfa7af:
  fVar12.high = uVar6;
  fVar12.low = uVar8;
  return fVar12;
}

Assistant:

static float128 propagateFloat128NaN(float128 a, float128 b,
                                     float_status *status)
{
    flag aIsLargerSignificand;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!float128_is_any_nan(a)
             ? float_class_normal
             : float128_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!float128_is_any_nan(b)
             ? float_class_normal
             : float128_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return float128_default_nan(status);
    }

    if (lt128(a.high << 1, a.low, b.high << 1, b.low)) {
        aIsLargerSignificand = 0;
    } else if (lt128(b.high << 1, b.low, a.high << 1, a.low)) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (a.high < b.high) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return float128_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return float128_silence_nan(a, status);
        }
        return a;
    }
}